

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::handle_file_request(Server *this,Request *req,Response *res)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *type;
  undefined1 local_48 [8];
  string path;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  path.field_2._8_8_ = res;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = detail::is_valid_path(&req->path), bVar1)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &this->base_dir_,&req->path);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == '/')) {
      std::__cxx11::string::operator+=((string *)local_48,"index.html");
    }
    bVar1 = detail::is_file((string *)local_48);
    if (bVar1) {
      detail::read_file((string *)local_48,(string *)(path.field_2._8_8_ + 0x58));
      pcVar3 = detail::find_content_type((string *)local_48);
      if (pcVar3 != (char *)0x0) {
        Response::set_header((Response *)path.field_2._8_8_,"Content-Type",pcVar3);
      }
      *(undefined4 *)(path.field_2._8_8_ + 0x20) = 200;
      bVar1 = std::function::operator_cast_to_bool((function *)&this->file_request_handler_);
      if (bVar1) {
        std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                  (&this->file_request_handler_,req,(Response *)path.field_2._8_8_);
      }
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) goto LAB_001ea463;
  }
  this_local._7_1_ = 0;
LAB_001ea463:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::handle_file_request(Request &req, Response &res) {
  if (!base_dir_.empty() && detail::is_valid_path(req.path)) {
    std::string path = base_dir_ + req.path;

    if (!path.empty() && path.back() == '/') { path += "index.html"; }

    if (detail::is_file(path)) {
      detail::read_file(path, res.body);
      auto type = detail::find_content_type(path);
      if (type) { res.set_header("Content-Type", type); }
      res.status = 200;
      if (file_request_handler_) { file_request_handler_(req, res); }
      return true;
    }
  }

  return false;
}